

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O3

void do_unbind(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  int iVar3;
  AFFECT_DATA *paf;
  char *pcVar4;
  
  paf = check_bind(ch,"arms");
  if (paf == (AFFECT_DATA *)0x0) {
    paf = check_bind(ch,"head");
    if (paf == (AFFECT_DATA *)0x0) {
      paf = check_bind(ch,"legs");
      if (paf == (AFFECT_DATA *)0x0) {
        send_to_char("You are not bound.\n\r",ch);
        return;
      }
      iVar1 = number_percent();
      iVar2 = get_curr_stat(ch,3);
      iVar3 = get_curr_stat(ch,0);
      if (SBORROW4(iVar1,(iVar3 + iVar2) * 3) == iVar1 + (iVar3 + iVar2) * -3 < 0) {
        act("You struggle with the bindings on your legs, but fail to break them.",ch,(void *)0x0,
            (void *)0x0,3);
        pcVar4 = "$n struggles with the bindings on $s legs, but fails to break them.";
        goto LAB_0034de0a;
      }
      act("You pull the bindings on your legs, ripping them apart!",ch,(void *)0x0,(void *)0x0,3);
      pcVar4 = "$n pulls the bindings on $s legs, ripping them apart!";
    }
    else {
      iVar1 = number_percent();
      iVar2 = get_curr_stat(ch,3);
      if (SBORROW4(iVar1,iVar2 * 6) == iVar1 + iVar2 * -6 < 0) {
        act("You struggle with the sack on your head, but fail to remove it.",ch,(void *)0x0,
            (void *)0x0,3);
        pcVar4 = "$n struggles with the sack on $s head, but fails to remove it.";
LAB_0034de0a:
        act(pcVar4,ch,(void *)0x0,(void *)0x0,0);
        goto LAB_0034de19;
      }
      act("Staggering blindly, you manage to rip the sack off your head!",ch,(void *)0x0,(void *)0x0
          ,3);
      pcVar4 = "Staggering blindly, $n manages to rip the sack off $s head!";
    }
  }
  else {
    iVar1 = number_percent();
    iVar2 = get_curr_stat(ch,0);
    if (SBORROW4(iVar1,iVar2 * 6) == iVar1 + iVar2 * -6 < 0) {
      act("You struggle with the bindings on your arms, but fail to break them.",ch,(void *)0x0,
          (void *)0x0,3);
      pcVar4 = "$n struggles with the bindings on $s arms, but fails to break them.";
      goto LAB_0034de0a;
    }
    act("Exerting all of your strength, you break the bindings on your arms!",ch,(void *)0x0,
        (void *)0x0,3);
    pcVar4 = "Exerting all of $s strength, $n breaks the bindings on $s arms!";
  }
  act(pcVar4,ch,(void *)0x0,(void *)0x0,0);
  affect_remove(ch,paf);
LAB_0034de19:
  WAIT_STATE(ch,0xc);
  return;
}

Assistant:

void do_unbind(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA *af = check_bind(ch, "arms");

	if (af != nullptr)
	{
		if (number_percent() < get_curr_stat(ch, STAT_STR) * 6)
		{
			act("Exerting all of your strength, you break the bindings on your arms!", ch, 0, 0, TO_CHAR);
			act("Exerting all of $s strength, $n breaks the bindings on $s arms!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the bindings on your arms, but fail to break them.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the bindings on $s arms, but fails to break them.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else if ((af = check_bind(ch, "head")) != nullptr)
	{
		if (number_percent() < get_curr_stat(ch, STAT_DEX) * 6)
		{
			act("Staggering blindly, you manage to rip the sack off your head!", ch, 0, 0, TO_CHAR);
			act("Staggering blindly, $n manages to rip the sack off $s head!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the sack on your head, but fail to remove it.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the sack on $s head, but fails to remove it.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else if ((af = check_bind(ch, "legs")) != nullptr)
	{
		if (number_percent() < (get_curr_stat(ch, STAT_DEX) * 3 + get_curr_stat(ch, STAT_STR) * 3))
		{
			act("You pull the bindings on your legs, ripping them apart!", ch, 0, 0, TO_CHAR);
			act("$n pulls the bindings on $s legs, ripping them apart!", ch, 0, 0, TO_ROOM);
			affect_remove(ch, af);
		}
		else
		{
			act("You struggle with the bindings on your legs, but fail to break them.", ch, 0, 0, TO_CHAR);
			act("$n struggles with the bindings on $s legs, but fails to break them.", ch, 0, 0, TO_ROOM);
		}

		WAIT_STATE(ch, PULSE_VIOLENCE);
	}
	else
	{
		send_to_char("You are not bound.\n\r", ch);
	}
}